

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall Variable_variableMethods_Test::TestBody(Variable_variableMethods_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_360 [8];
  Message local_358 [15];
  allocator<char> local_349;
  string local_348 [32];
  shared_ptr<libcellml::Variable> local_328;
  undefined1 local_318 [16];
  AssertionResult gtest_ar_5;
  Message local_2f8 [8];
  shared_ptr<libcellml::Variable> local_2f0;
  undefined1 local_2e0 [16];
  AssertionResult gtest_ar_4;
  Message local_2c0 [8];
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_3;
  string a4;
  VariablePtr vMethod4;
  Message local_270 [8];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  string a3;
  string local_230 [32];
  undefined1 local_210 [8];
  VariablePtr vMethod3;
  Message local_1f8 [8];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_1;
  string a2;
  VariablePtr vMethod2;
  Message local_1a8 [8];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  string a1;
  string local_168 [32];
  undefined1 local_148 [8];
  VariablePtr vMethod1;
  string local_130 [32];
  undefined1 local_110 [8];
  VariablePtr v4;
  string local_f8 [32];
  undefined1 local_d8 [8];
  VariablePtr v3;
  string local_c0 [32];
  undefined1 local_a0 [8];
  VariablePtr v2;
  string local_88 [32];
  undefined1 local_68 [8];
  VariablePtr v1;
  ComponentPtr c;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Variable_variableMethods_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"valid_name",&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::NamedEntity::setName((string *)peVar2);
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"variable1",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"variable2",
             (allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"variable3",
             (allocator<char> *)
             ((long)&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"variable4",
             (allocator<char> *)
             ((long)&vMethod1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vMethod1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"variable1",(allocator<char> *)(a1.field_2._M_local_buf + 0xf));
  libcellml::Component::variable((string *)local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)(a1.field_2._M_local_buf + 0xf));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_148);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_1a0,"\"variable1\"","a1",(char (*) [10])"variable1",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &vMethod2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2fc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &vMethod2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_1a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &vMethod2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Component::variable((ulong)((long)&a2.field_2 + 8));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             (a2.field_2._M_local_buf + 8));
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_1f0,"\"variable2\"","a2",(char (*) [10])"variable2",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &vMethod3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x301,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &vMethod3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_1f8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &vMethod3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"variable3",(allocator<char> *)(a3.field_2._M_local_buf + 0xf));
  libcellml::Component::variable((string *)local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)(a3.field_2._M_local_buf + 0xf));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_210);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_268,"\"variable3\"","a3",(char (*) [10])"variable3",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &vMethod4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x306,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &vMethod4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_270);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &vMethod4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Component::variable((ulong)((long)&a4.field_2 + 8));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             (a4.field_2._M_local_buf + 8));
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_2b8,"\"variable4\"","a4",(char (*) [10])"variable4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_3.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(local_2c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x30b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_2e0._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Component::variable((ulong)&local_2f0);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_2e0 + 8,"nullptr",(void **)"c->variable(7)",
             (shared_ptr<libcellml::Variable> *)local_2e0,&local_2f0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2e0 + 8));
  if (!bVar1) {
    testing::Message::Message(local_2f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_2e0 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x30e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_2e0 + 8));
  local_318._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"doesntexist",&local_349);
  libcellml::Component::variable((string *)&local_328);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_318 + 8,"nullptr",(void **)"c->variable(\"doesntexist\")",
             (shared_ptr<libcellml::Variable> *)local_318,&local_328);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_318 + 8));
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_318 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x311,pcVar4);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_318 + 8));
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)((long)&a4.field_2 + 8));
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_210);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)((long)&a2.field_2 + 8));
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_110);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Variable, variableMethods)
{
    const std::string in = "valid_name";
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName(in);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("variable1");
    c->addVariable(v1);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("variable2");
    c->addVariable(v2);
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("variable3");
    c->addVariable(v3);
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    v4->setName("variable4");
    c->addVariable(v4);

    // Get by string
    libcellml::VariablePtr vMethod1 = c->variable("variable1");
    const std::string a1 = vMethod1->name();
    EXPECT_EQ("variable1", a1);

    // Get by index
    libcellml::VariablePtr vMethod2 = c->variable(1);
    const std::string a2 = vMethod2->name();
    EXPECT_EQ("variable2", a2);

    // Get const by string
    const libcellml::VariablePtr vMethod3 = c->variable("variable3");
    const std::string a3 = vMethod3->name();
    EXPECT_EQ("variable3", a3);

    // Get const by index
    const libcellml::VariablePtr vMethod4 = c->variable(3);
    const std::string a4 = vMethod4->name();
    EXPECT_EQ("variable4", a4);

    // Get invalid index
    EXPECT_EQ(nullptr, c->variable(7));

    // Get non-existent variable by string
    EXPECT_EQ(nullptr, c->variable("doesntexist"));
}